

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strtr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *zString;
  char *zMask;
  long lVar2;
  int c;
  int nLen;
  int iOfft;
  char *local_78;
  SyBlob sWorker;
  str_replace_data sRepData;
  
  if (nArg < 1) {
    jx9_result_bool(pCtx,0);
    return 0;
  }
  zString = jx9_value_to_string(*apArg,&nLen);
  if (nArg != 1 && 0 < nLen) {
    if (nArg == 2) {
      if ((apArg[1]->iFlags & 0x40) != 0) {
        sWorker.pAllocator = &pCtx->pVm->sAllocator;
        sWorker.pBlob = (void *)0x0;
        sWorker.nByte = 0;
        sWorker.mByte = 0;
        sWorker.nFlags = 0;
        SyBlobAppend(&sWorker,zString,nLen);
        sRepData.xMatch = SyBlobSearch;
        sRepData.pWorker = &sWorker;
        jx9_array_walk(apArg[1],StringReplaceWalker,&sRepData);
        jx9_result_string(pCtx,(char *)sWorker.pBlob,sWorker.nByte);
        SyBlobRelease(&sWorker);
        return 0;
      }
    }
    else {
      zMask = jx9_value_to_string(apArg[1],(int *)&sRepData);
      local_78 = jx9_value_to_string(apArg[2],(int *)&sWorker);
      if ((0 < (int)sRepData.pWorker) && (0 < (int)sWorker.pAllocator)) {
        for (lVar2 = 0; lVar2 < nLen; lVar2 = lVar2 + 1) {
          c = (int)zString[lVar2];
          iVar1 = CheckMask(c,zMask,(int)sRepData.pWorker,&iOfft);
          if (iVar1 != 0) {
            if (iOfft < (int)sWorker.pAllocator) {
              c = (int)local_78[iOfft];
            }
          }
          jx9_result_string(pCtx,(char *)&c,1);
        }
        return 0;
      }
    }
  }
  jx9_result_string(pCtx,zString,nLen);
  return 0;
}

Assistant:

static int jx9Builtin_strtr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Nothing to replace, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 || nArg < 2 ){
		/* Invalid arguments */
		jx9_result_string(pCtx, zIn, nLen);
		return JX9_OK;
	}
	if( nArg == 2 && jx9_value_is_json_array(apArg[1]) ){
		str_replace_data sRepData;
		SyBlob sWorker;
		/* Initilaize the working buffer */
		SyBlobInit(&sWorker, &pCtx->pVm->sAllocator);
		/* Copy raw string */
		SyBlobAppend(&sWorker, (const void *)zIn, (sxu32)nLen);
		/* Init our replace data instance */
		sRepData.pWorker = &sWorker;
		sRepData.xMatch = SyBlobSearch;
		/* Iterate throw array entries and perform the replace operation.*/
		jx9_array_walk(apArg[1], StringReplaceWalker, &sRepData);
		/* All done, return the result string */
		jx9_result_string(pCtx, (const char *)SyBlobData(&sWorker), 
			(int)SyBlobLength(&sWorker)); /* Will make it's own copy */
		/* Clean-up */
		SyBlobRelease(&sWorker);
	}else{
		int i, flen, tlen, c, iOfft;
		const char *zFrom, *zTo;
		if( nArg < 3 ){
			/* Nothing to replace */
			jx9_result_string(pCtx, zIn, nLen);
			return JX9_OK;
		}
		/* Extract given arguments */
		zFrom = jx9_value_to_string(apArg[1], &flen);
		zTo = jx9_value_to_string(apArg[2], &tlen);
		if( flen < 1 || tlen < 1 ){
			/* Nothing to replace */
			jx9_result_string(pCtx, zIn, nLen);
			return JX9_OK;
		}
		/* Start the replace process */
		for( i = 0 ; i < nLen ; ++i ){
			c = zIn[i];
			if( CheckMask(c, zFrom, flen, &iOfft) ){
				if ( iOfft < tlen ){
					c = zTo[iOfft];
				}
			}
			jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			
		}
	}
	return JX9_OK;
}